

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int descriptor_scriptpubkey_to_address
              (address_script_t *address_item,uchar *script,size_t script_len,char **output)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uchar hash [33];
  uchar local_28;
  undefined8 local_27;
  undefined8 uStack_1f;
  undefined4 local_17;
  
  if ((long)script_len < 0x19) {
    if (script_len == 0x16) {
      if ((*script == '\0') && (script[1] == '\x14')) {
LAB_00107af3:
        iVar1 = wally_addr_segwit_from_bytes(script,script_len,address_item->segwit_prefix,0,output)
        ;
        return iVar1;
      }
    }
    else if (((script_len == 0x17) && (*script == 0xa9)) && (script[1] == '\x14')) {
      lVar3 = 2;
      lVar2 = 2;
      if (script[0x16] == 0x87) goto LAB_00107a74;
    }
  }
  else if (script_len == 0x22) {
    if ((*script == '\0') && (script[1] == ' ')) goto LAB_00107af3;
  }
  else if (((script_len == 0x19) &&
           (((*script == 'v' && (script[1] == 0xa9)) && (script[2] == '\x14')))) &&
          ((script[0x17] == 0x88 && (script[0x18] == 0xac)))) {
    lVar2 = 3;
    lVar3 = 1;
LAB_00107a74:
    local_28 = (&address_item->network)[lVar3];
    local_27 = *(undefined8 *)(script + lVar2);
    uStack_1f = *(undefined8 *)(script + lVar2 + 8);
    local_17 = *(undefined4 *)(script + lVar2 + 0x10);
    iVar1 = wally_base58_from_bytes(&local_28,0x15,1,output);
    return iVar1;
  }
  return -2;
}

Assistant:

static int descriptor_scriptpubkey_to_address(
    const struct address_script_t *address_item,
    unsigned char *script,
    size_t script_len,
    char **output)
{
    int ret;
    int script_type = 0;
    size_t hash_len = 0;
    unsigned char hash[SHA256_LEN + 1];

    if ((script_len == WALLY_SCRIPTPUBKEY_P2PKH_LEN) &&
        (script[0] == OP_DUP) &&
        (script[1] == OP_HASH160) &&
        (script[2] == HASH160_LEN) &&
        (script[WALLY_SCRIPTPUBKEY_P2PKH_LEN - 2] == OP_EQUALVERIFY) &&
        (script[WALLY_SCRIPTPUBKEY_P2PKH_LEN - 1] == OP_CHECKSIG)) {
        script_type = WALLY_SCRIPT_TYPE_P2PKH;
        hash[0] = address_item->version_p2pkh;
        memcpy(&hash[1], &script[3], HASH160_LEN);
        hash_len = HASH160_LEN + 1;
    } else if ((script_len == WALLY_SCRIPTPUBKEY_P2SH_LEN) &&
               (script[0] == OP_HASH160) &&
               (script[1] == HASH160_LEN) &&
               (script[WALLY_SCRIPTPUBKEY_P2SH_LEN - 1] == OP_EQUAL)) {
        script_type = WALLY_SCRIPT_TYPE_P2SH;
        hash[0] = address_item->version_p2sh;
        memcpy(&hash[1], &script[2], HASH160_LEN);
        hash_len = HASH160_LEN + 1;
    } else if ((script_len == WALLY_SCRIPTPUBKEY_P2WPKH_LEN) &&
               (script[0] == OP_0) && (script[1] == HASH160_LEN)) {
        script_type = WALLY_SCRIPT_TYPE_P2WPKH;
    } else if ((script_len == WALLY_SCRIPTPUBKEY_P2WSH_LEN) &&
               (script[0] == OP_0) &&
               (script[1] == SHA256_LEN)) {
        script_type = WALLY_SCRIPT_TYPE_P2WSH;
        /* feature: append witness v1 */
    } else {
        ret = WALLY_EINVAL;
    }

    if ((script_type == WALLY_SCRIPT_TYPE_P2PKH) || (script_type == WALLY_SCRIPT_TYPE_P2SH)) {
        ret = wally_base58_from_bytes(hash, hash_len, BASE58_FLAG_CHECKSUM, output);
    } else if ((script_type == WALLY_SCRIPT_TYPE_P2WPKH) ||
               (script_type == WALLY_SCRIPT_TYPE_P2WSH)) {
        ret = wally_addr_segwit_from_bytes(script, script_len, address_item->segwit_prefix, 0, output);
    }
    return ret;
}